

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O2

void __thiscall QStyleOptionGroupBox::QStyleOptionGroupBox(QStyleOptionGroupBox *this)

{
  QStyleOptionGroupBox(this,1);
  return;
}

Assistant:

QStyleOptionGroupBox::QStyleOptionGroupBox()
    : QStyleOptionGroupBox(Version)
{
}